

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_to_type.cpp
# Opt level: O0

ScalarFunction * duckdb::CastToTypeFun::GetFunction(void)

{
  initializer_list<duckdb::LogicalType> iVar1;
  ScalarFunction *in_RDI;
  ScalarFunction *fun;
  allocator_type *in_stack_fffffffffffffea8;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffeb0;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  LogicalType *local_f0;
  LogicalType local_d0 [24];
  undefined1 local_b8 [32];
  LogicalType local_98 [40];
  LogicalType *local_70;
  LogicalType local_68 [24];
  LogicalType local_50 [24];
  LogicalType *local_38;
  undefined8 local_30;
  undefined1 local_28 [31];
  undefined1 local_9;
  
  local_9 = 0;
  local_70 = local_68;
  duckdb::LogicalType::LogicalType(local_70,ANY);
  local_70 = local_50;
  duckdb::LogicalType::LogicalType(local_70,ANY);
  local_38 = local_68;
  local_30 = 2;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0xd308ed);
  iVar1._M_len._0_4_ = in_stack_fffffffffffffec0;
  iVar1._M_array = (iterator)in_stack_fffffffffffffeb8;
  iVar1._M_len._4_4_ = in_stack_fffffffffffffec4;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffeb0,iVar1,in_stack_fffffffffffffea8);
  duckdb::LogicalType::LogicalType(local_98,ANY);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),in_stack_fffffffffffffeb8
            );
  duckdb::LogicalType::LogicalType(local_d0,INVALID);
  duckdb::ScalarFunction::ScalarFunction(in_RDI,local_28,local_98,local_b8,0,0,0,0,local_d0,0,0,0);
  duckdb::LogicalType::~LogicalType(local_d0);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xd309c4);
  duckdb::LogicalType::~LogicalType(local_98);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xd309de);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0xd309eb);
  local_f0 = (LogicalType *)&local_38;
  do {
    local_f0 = local_f0 + -0x18;
    duckdb::LogicalType::~LogicalType(local_f0);
  } while (local_f0 != local_68);
  in_RDI->field_0xa9 = 1;
  in_RDI->bind_expression = BindCastToTypeFunction;
  return in_RDI;
}

Assistant:

ScalarFunction CastToTypeFun::GetFunction() {
	auto fun = ScalarFunction({LogicalType::ANY, LogicalType::ANY}, LogicalType::ANY, CastToTypeFunction);
	fun.null_handling = FunctionNullHandling::SPECIAL_HANDLING;
	fun.bind_expression = BindCastToTypeFunction;
	return fun;
}